

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.c
# Opt level: O1

Expr remainder_builtin(pExecutor exec,pContext_conflict defContext,pContext_conflict callContext,
                      Expr *args,int argc)

{
  ValueType VVar1;
  ValueType VVar2;
  anon_union_8_8_707b72ea_for_Expr_1 aVar3;
  anon_union_8_8_707b72ea_for_Expr_1 aVar4;
  Expr *__ptr;
  char *__s;
  Expr EVar5;
  Expr b;
  
  if (argc < 2) {
    __s = "remainder: too few arguments";
  }
  else {
    if (argc == 2) {
      __ptr = exec_eval_each(exec,callContext,args,2);
      VVar1 = __ptr->type;
      aVar3 = (anon_union_8_8_707b72ea_for_Expr_1)(__ptr->field_1).val_atom;
      VVar2 = __ptr[1].type;
      aVar4 = (anon_union_8_8_707b72ea_for_Expr_1)__ptr[1].field_1.val_atom;
      free(__ptr);
      EVar5._4_4_ = 0;
      EVar5.type = VVar1;
      b._4_4_ = 0;
      b.type = VVar2;
      EVar5.field_1 =
           (anon_union_8_8_707b72ea_for_Expr_1)(anon_union_8_8_707b72ea_for_Expr_1)aVar3.val_atom;
      b.field_1 = (anon_union_8_8_707b72ea_for_Expr_1)
                  (anon_union_8_8_707b72ea_for_Expr_1)aVar4.val_atom;
      EVar5 = exec_remainder(exec,EVar5,b);
      return EVar5;
    }
    __s = "remainder: too many arguments";
  }
  puts(__s);
  exit(1);
}

Assistant:

BUILTIN_FUNC(remainder_builtin)
{
    if (argc < 2)
    {
        log("remainder: too few arguments");
        exit(1);
    }
    if (argc > 2)
    {
        log("remainder: too many arguments");
        exit(1);
    }
    Expr *values = exec_eval_each(exec, callContext, args, argc);

    Expr first = values[0];
    Expr second = values[1];
    free(values);

    return exec_remainder(exec, first, second);
}